

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  SchemaLoader loader;
  Runnable local_180;
  undefined1 *local_178;
  NullableValue<kj::Exception> local_170;
  
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            (&loader);
  local_180._vptr_Runnable = (_func_int **)&PTR_run_0065b538;
  local_178 = (undefined1 *)&loader;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,&local_180);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_170);
  if ((local_170.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[153]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xe9,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr\""
               ,(char (*) [153])
                "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr"
              );
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}